

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O2

void __thiscall
ParsedAC3TrackData::extractData(ParsedAC3TrackData *this,AVPacket *pkt,uint8_t *buff,int size)

{
  int iVar1;
  bool bVar2;
  uint16_t uVar3;
  uint8_t *__dest;
  
  if ((2 < size) && (this->m_firstPacket != false)) {
    uVar3 = AV_RB16(buff);
    if (uVar3 != 0xb77) {
      this->m_shortHeaderMode = true;
    }
  }
  this->m_firstPacket = false;
  bVar2 = this->m_shortHeaderMode;
  iVar1 = size + (uint)bVar2 * 2;
  pkt->size = iVar1;
  __dest = (uint8_t *)operator_new__((long)iVar1);
  pkt->data = __dest;
  if (bVar2 == 1) {
    __dest[0] = '\v';
    __dest[1] = 'w';
    __dest = __dest + 2;
  }
  memcpy(__dest,buff,(long)size);
  return;
}

Assistant:

void ParsedAC3TrackData::extractData(AVPacket* pkt, uint8_t* buff, const int size)
{
    if (m_firstPacket && size > 2)
    {
        if (AV_RB16(buff) != 0x0b77)
            m_shortHeaderMode = true;
    }
    m_firstPacket = false;
    pkt->size = size + (m_shortHeaderMode ? 2 : 0);
    pkt->data = new uint8_t[pkt->size];
    uint8_t* dst = pkt->data;
    if (m_shortHeaderMode)
    {
        *dst++ = 0x0b;
        *dst++ = 0x77;
    }
    memcpy(dst, buff, size);
}